

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# include.hpp
# Opt level: O2

t_GSA __thiscall egsa_stream::read_el(egsa_stream *this)

{
  ostream *poVar1;
  ifstream *piVar2;
  ulong unaff_RBP;
  ulong unaff_R12;
  uint *puVar3;
  ulong unaff_R15;
  t_GSA tVar4;
  uint8_t x8;
  uint8_t x8_7;
  uint8_t x8_6;
  uint8_t x8_5;
  uint8_t x8_3;
  uint8_t x8_2;
  uint8_t x8_1;
  uint16_t x16_5;
  uint16_t x16_4;
  uint16_t x16_3;
  uint16_t x16_2;
  uint16_t x16_1;
  uint16_t x16;
  uint32_t x32_5;
  uint32_t x32_4;
  uint32_t x32_3;
  uint32_t x32_2;
  uint32_t x32_1;
  uint32_t x32;
  
  if (this->egsa != true) {
    if (this->bcr != true) {
      poVar1 = std::operator<<((ostream *)&std::cout,"Error: missing index files.");
      std::endl<char,std::char_traits<char>>(poVar1);
      exit(1);
    }
    switch(this->suff_size) {
    case 1:
      std::istream::read((char *)&this->GSA,(long)&x8_5);
      unaff_R15 = (ulong)x8_5;
      break;
    case 2:
      std::istream::read((char *)&this->GSA,(long)&x16_3);
      unaff_R15 = (ulong)x16_3;
      break;
    case 4:
      puVar3 = &x32_3;
      goto LAB_0010bb3b;
    case 8:
      puVar3 = (uint *)&x8;
LAB_0010bb3b:
      std::istream::read((char *)&this->GSA,(long)puVar3);
      unaff_R15 = (ulong)*puVar3;
    }
    switch(this->da_size) {
    case 1:
      std::istream::read((char *)&this->GSA,(long)&x8_6);
      unaff_RBP = (ulong)x8_6;
      break;
    case 2:
      std::istream::read((char *)&this->GSA,(long)&x16_4);
      unaff_RBP = (ulong)x16_4;
      break;
    case 4:
      puVar3 = &x32_4;
      goto LAB_0010bbb9;
    case 8:
      puVar3 = (uint *)&x8;
LAB_0010bbb9:
      std::istream::read((char *)&this->GSA,(long)puVar3);
      unaff_RBP = (ulong)*puVar3;
    }
    switch(this->lcp_size) {
    case 1:
      std::istream::read((char *)&this->LCP,(long)&x8_7);
      unaff_R12 = (ulong)x8_7;
      break;
    case 2:
      std::istream::read((char *)&this->LCP,(long)&x16_5);
      unaff_R12 = (ulong)x16_5;
      break;
    case 4:
      puVar3 = &x32_5;
      goto LAB_0010bc37;
    case 8:
      puVar3 = (uint *)&x8;
LAB_0010bc37:
      std::istream::read((char *)&this->LCP,(long)puVar3);
      unaff_R12 = (ulong)*puVar3;
    }
    piVar2 = &this->BWT;
    goto LAB_0010bc4a;
  }
  switch(this->da_size) {
  case 1:
    std::istream::read((char *)&this->EGSA,(long)&x8_1);
    unaff_RBP = (ulong)x8_1;
    break;
  case 2:
    std::istream::read((char *)&this->EGSA,(long)&x16);
    unaff_RBP = (ulong)x16;
    break;
  case 4:
    puVar3 = &x32;
    goto LAB_0010ba07;
  case 8:
    puVar3 = (uint *)&x8;
LAB_0010ba07:
    std::istream::read((char *)&this->EGSA,(long)puVar3);
    unaff_RBP = (ulong)*puVar3;
  }
  switch(this->suff_size) {
  case 1:
    std::istream::read((char *)&this->EGSA,(long)&x8_2);
    unaff_R15 = (ulong)x8_2;
    break;
  case 2:
    std::istream::read((char *)&this->EGSA,(long)&x16_1);
    unaff_R15 = (ulong)x16_1;
    break;
  case 4:
    puVar3 = &x32_1;
    goto LAB_0010ba79;
  case 8:
    puVar3 = (uint *)&x8;
LAB_0010ba79:
    std::istream::read((char *)&this->EGSA,(long)puVar3);
    unaff_R15 = (ulong)*puVar3;
  }
  switch(this->lcp_size) {
  case 1:
    std::istream::read((char *)&this->EGSA,(long)&x8_3);
    unaff_R12 = (ulong)x8_3;
    break;
  case 2:
    std::istream::read((char *)&this->EGSA,(long)&x16_2);
    unaff_R12 = (ulong)x16_2;
    break;
  case 4:
    puVar3 = &x32_2;
    goto LAB_0010baeb;
  case 8:
    puVar3 = (uint *)&x8;
LAB_0010baeb:
    std::istream::read((char *)&this->EGSA,(long)puVar3);
    unaff_R12 = (ulong)*puVar3;
  }
  piVar2 = &this->EGSA;
LAB_0010bc4a:
  std::istream::read((char *)piVar2,(long)&x8);
  tVar4._0_8_ = unaff_RBP & 0xffffffff | unaff_R15 << 0x20;
  tVar4._8_8_ = unaff_R12 & 0xffffffff | (ulong)x8 << 0x20;
  return tVar4;
}

Assistant:

t_GSA read_el(){

		t_GSA e;

		if(egsa){

			switch(da_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.text = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.text = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.text = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.text = x64; break;

			}

			switch(suff_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.suff = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.suff = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.suff = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.suff = x64; break;

			}

			switch(lcp_size){

				case 1 : uint8_t x8; EGSA.read((char*)&x8, 1); e.lcp = x8;  break;
				case 2 : uint16_t x16; EGSA.read((char*)&x16, 2); e.lcp = x16; break;
				case 4 : uint32_t x32; EGSA.read((char*)&x32, 4); e.lcp = x32; break;
				case 8 : uint64_t x64; EGSA.read((char*)&x64, 8); e.lcp = x64; break;

			}

			uint8_t x8;
			EGSA.read((char*)&x8, 1);
			e.bwt = x8;

		}else if(bcr){

			switch(suff_size){

				case 1 : uint8_t x8; GSA.read((char*)&x8, 1); e.suff = x8;  break;
				case 2 : uint16_t x16; GSA.read((char*)&x16, 2); e.suff = x16; break;
				case 4 : uint32_t x32; GSA.read((char*)&x32, 4); e.suff = x32; break;
				case 8 : uint64_t x64; GSA.read((char*)&x64, 8); e.suff = x64; break;

			}

			switch(da_size){

				case 1 : uint8_t x8; GSA.read((char*)&x8, 1); e.text = x8;  break;
				case 2 : uint16_t x16; GSA.read((char*)&x16, 2); e.text = x16; break;
				case 4 : uint32_t x32; GSA.read((char*)&x32, 4); e.text = x32; break;
				case 8 : uint64_t x64; GSA.read((char*)&x64, 8); e.text = x64; break;

			}

			switch(lcp_size){

				case 1 : uint8_t x8; LCP.read((char*)&x8, 1); e.lcp = x8;  break;
				case 2 : uint16_t x16; LCP.read((char*)&x16, 2); e.lcp = x16; break;
				case 4 : uint32_t x32; LCP.read((char*)&x32, 4); e.lcp = x32; break;
				case 8 : uint64_t x64; LCP.read((char*)&x64, 8); e.lcp = x64; break;

			}

			uint8_t x8;
			BWT.read((char*)&x8, 1);
			e.bwt = x8;

		}else{

			cout << "Error: missing index files." << endl;
			exit(1);

		}

		return e;

	}